

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O1

int __thiscall CTPNCall::gen_code_rand(CTPNCall *this,int discard,int for_condition)

{
  CTcPrsNode *pCVar1;
  CTcGenTarg *pCVar2;
  uint uVar3;
  uint16_t tmp_1;
  int iVar4;
  CTcCodeLabel *lbl;
  CTPNArg *pCVar5;
  size_t __n;
  int iVar6;
  ulong ofs;
  uint16_t tmp;
  char buf [2];
  char buf_1 [5];
  CTcNamedArgs named_args;
  undefined2 local_6a;
  uint local_68;
  uint local_64;
  vm_val_t local_60;
  CTPNArglist *local_50;
  char local_45 [5];
  undefined4 local_40 [4];
  
  local_50 = (this->super_CTPNCallBase).arglist_;
  iVar6 = (local_50->super_CTPNArglistBase).argc_;
  iVar4 = 0;
  if (1 < (long)iVar6) {
    for (pCVar5 = (local_50->super_CTPNArglistBase).list_; pCVar5 != (CTPNArg *)0x0;
        pCVar5 = (pCVar5->super_CTPNArgBase).next_arg_) {
      if (((pCVar5->super_CTPNArgBase).field_0x40 & 1) != 0) {
        return 0;
      }
    }
    local_40[0] = 0;
    local_68 = discard;
    local_64 = for_condition;
    CTPNConst::s_gen_code_int((long)iVar6);
    pCVar1 = (this->super_CTPNCallBase).func_;
    __n = 0;
    (*(pCVar1->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0x15])(pCVar1,0,1,0,local_40);
    CTcGenTarg::write_op(G_cg,0x90);
    local_60.typ = CONCAT22(local_60.typ._2_2_,(short)iVar6);
    CTcDataStream::write(&G_cs->super_CTcDataStream,(int)&local_60,(void *)0x2,__n);
    G_cg->sp_depth_ = G_cg->sp_depth_ + -1;
    ofs = (G_cs->super_CTcDataStream).ofs_;
    iVar6 = iVar6 + 1;
    do {
      local_60.val.obj = iVar6 - 2;
      local_60.typ = VM_INT;
      vmb_put_dh(local_45,&local_60);
      CTcDataStream::write(&G_cs->super_CTcDataStream,(int)local_45,(void *)0x5,__n);
      local_6a = 0;
      CTcDataStream::write(&G_cs->super_CTcDataStream,(int)&local_6a,(void *)0x2,__n);
      iVar6 = iVar6 + -1;
    } while (1 < iVar6);
    local_60.typ = local_60.typ & 0xffff0000;
    CTcDataStream::write(&G_cs->super_CTcDataStream,(int)&local_60,(void *)0x2,__n);
    lbl = CTcCodeStream::new_label_fwd(G_cs);
    uVar3 = local_68;
    pCVar5 = (local_50->super_CTPNArglistBase).list_;
    if (pCVar5 != (CTPNArg *)0x0) {
      iVar6 = -5 - (int)ofs;
      do {
        local_60.typ = CONCAT22(local_60.typ._2_2_,
                                (short)(G_cs->super_CTcDataStream).ofs_ + (short)iVar6);
        CTcDataStream::write_at(&G_cs->super_CTcDataStream,ofs + 5,(char *)&local_60,2);
        pCVar1 = (pCVar5->super_CTPNArgBase).arg_expr_;
        (**(pCVar1->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase)(pCVar1,(ulong)uVar3,(ulong)local_64)
        ;
        CTcGenTarg::write_op(G_cg,0x91);
        CTcCodeStream::write_ofs(G_cs,lbl,0,0);
        if (uVar3 == 0) {
          G_cg->sp_depth_ = G_cg->sp_depth_ + -1;
        }
        ofs = ofs + 7;
        pCVar5 = (pCVar5->super_CTPNArgBase).next_arg_;
        iVar6 = iVar6 + -7;
      } while (pCVar5 != (CTPNArg *)0x0);
    }
    local_60.typ = CONCAT22(local_60.typ._2_2_,
                            (short)(int)(G_cs->super_CTcDataStream).ofs_ - (short)ofs);
    CTcDataStream::write_at(&G_cs->super_CTcDataStream,ofs,(char *)&local_60,2);
    if (uVar3 == 0) {
      CTcGenTarg::write_op(G_cg,'\b');
      pCVar2 = G_cg;
      iVar4 = G_cg->sp_depth_;
      iVar6 = iVar4 + 1;
      G_cg->sp_depth_ = iVar6;
      if (pCVar2->max_sp_depth_ <= iVar4) {
        pCVar2->max_sp_depth_ = iVar6;
      }
    }
    CTcPrsNode::def_label_pos(lbl);
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

int CTPNCall::gen_code_rand(int discard, int for_condition)
{
    /* get our argument list, and the number of arguments */
    CTPNArglist *args = get_arg_list();
    int argc = args->get_argc();

    /* if we have zero or one argument, use the normal call */
    if (argc < 2)
        return FALSE;

    /* if we have variable arguments, use the normal call */
    CTPNArg *arg;
    for (arg = args->get_arg_list_head() ; arg != 0 ;
         arg = arg->get_next_arg())
    {
        if (arg->is_varargs())
            return FALSE;
    }

    /* 
     *   We have a fixed number of arguments greater than one, so this is the
     *   special form of the rand() call.  First, generate an ordinary call
     *   to rand() to select a number from 0 to argc-1.
     */
    CTcNamedArgs named_args;
    named_args.cnt = 0;
    CTPNConst::s_gen_code_int(argc);
    get_func()->gen_code_call(FALSE, 1, FALSE, &named_args);

    /* generate the SWITCH <case_cnt> */
    G_cg->write_op(OPC_SWITCH);
    G_cs->write2(argc);
    G_cg->note_pop();

    /* 
     *   Build the case table.  The rand() call gave us an integer from 0 to
     *   argc-1 inclusive, so our case labels are simply the argument index
     *   values, starting at zero.  Note that the argument list is stored
     *   right to left, so the index values of the list elements run from
     *   argc-1 down to 0.  Since we're making a random selection anyway the
     *   order shouldn't really matter; however, for the sake of regression
     *   tests for pre-3.1 games, we want to use the same index ordering that
     *   rand() did in the old version, where rand() itself chose one of its
     *   pre-evaluated arguments.  When running in regression mode with a
     *   fixed random number stream, using the same index ordering will
     *   ensure that we get the same results when running existing tests.  
     */
    ulong caseofs = G_cs->get_ofs();
    int i;
    for (i = argc - 1 ; i >= 0 ; --i)
    {
        /* write the case label as the 0-based argument index */
        char buf[VMB_DATAHOLDER];
        vm_val_t val;
        val.set_int(i);
        vmb_put_dh(buf, &val);
        G_cs->write(buf, VMB_DATAHOLDER);

        /* write a placeholder for the jump offset */
        G_cs->write2(0);
    }

    /* write a placeholder for the default case */
    G_cs->write2(0);

    /* create a forward label for the 'break' to the end of the switch */
    CTcCodeLabel *brklbl = G_cs->new_label_fwd();

    /* generate the argument expressions */
    for (arg = args->get_arg_list_head() ; arg != 0 ;
         arg = arg->get_next_arg(), caseofs += VMB_DATAHOLDER + 2)
    {
        /* set the jump to this case in the case table */
        G_cs->write2_at(caseofs + VMB_DATAHOLDER,
                        G_cs->get_ofs() - (caseofs + VMB_DATAHOLDER));

        /* generate the argument expression */
        arg->get_arg_expr()->gen_code(discard, for_condition);

        /* generate a jump to the end of the table */
        G_cg->write_op(OPC_JMP);
        G_cs->write_ofs2(brklbl, 0);

        /* we generate the branches in parallel, so only one push counts */
        if (!discard)
            G_cg->note_pop();
    }

    /* write the default case - just push nil if we need a value */
    G_cs->write2_at(caseofs, G_cs->get_ofs() - caseofs);
    if (!discard)
    {
        G_cg->write_op(OPC_PUSHNIL);
        G_cg->note_push();
    }

    /* this is the end of the switch - set the 'break' label here */
    def_label_pos(brklbl);

    /* tell the caller that we handled the code generation */
    return TRUE;
}